

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlRefPtr xmlAddRef(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlHashTablePtr table;
  xmlRefPtr data;
  xmlChar *pxVar2;
  long lVar3;
  xmlListPtr l;
  xmlAttrPtr pxVar4;
  char *pcVar5;
  
  if (attr == (xmlAttrPtr)0x0 || (value == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0)) {
    return (xmlRefPtr)0x0;
  }
  table = (xmlHashTablePtr)doc->refs;
  if (table == (xmlHashTablePtr)0x0) {
    table = xmlHashCreateDict(0,doc->dict);
    doc->refs = table;
    if (table == (xmlHashTablePtr)0x0) {
      pcVar5 = "xmlAddRef: Table creation failed!\n";
      goto LAB_0018b59f;
    }
  }
  data = (xmlRefPtr)(*xmlMalloc)(0x28);
  if (data == (xmlRefPtr)0x0) {
    pcVar5 = "malloc failed";
LAB_0018b59f:
    xmlVErrMemory(ctxt,pcVar5);
    return (xmlRefPtr)0x0;
  }
  pxVar2 = xmlStrdup(value);
  data->value = pxVar2;
  iVar1 = xmlIsStreaming(ctxt);
  if (iVar1 == 0) {
    pxVar2 = (xmlChar *)0x0;
    pxVar4 = attr;
  }
  else {
    pxVar2 = xmlStrdup(attr->name);
    pxVar4 = (xmlAttrPtr)0x0;
  }
  data->name = pxVar2;
  data->attr = pxVar4;
  lVar3 = xmlGetLineNo(attr->parent);
  data->lineno = (int)lVar3;
  l = (xmlListPtr)xmlHashLookup(table,value);
  if (l == (xmlListPtr)0x0) {
    l = xmlListCreate(xmlFreeRef,xmlDummyCompare);
    if (l == (xmlListPtr)0x0) {
      pcVar5 = "xmlAddRef: Reference list creation failed!\n";
      goto LAB_0018b51f;
    }
    iVar1 = xmlHashAddEntry(table,value,l);
    if (-1 < iVar1) goto LAB_0018b505;
    xmlListDelete(l);
  }
  else {
LAB_0018b505:
    iVar1 = xmlListAppend(l,data);
    if (iVar1 == 0) {
      return data;
    }
  }
  pcVar5 = "xmlAddRef: Reference list insertion failed!\n";
LAB_0018b51f:
  xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,pcVar5,(char *)0x0);
  if (data->value != (xmlChar *)0x0) {
    (*xmlFree)(data->value);
  }
  if (data->name != (xmlChar *)0x0) {
    (*xmlFree)(data->name);
  }
  (*xmlFree)(data);
  return (xmlRefPtr)0x0;
}

Assistant:

xmlRefPtr
xmlAddRef(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
    xmlAttrPtr attr) {
    xmlRefPtr ret;
    xmlRefTablePtr table;
    xmlListPtr ref_list;

    if (doc == NULL) {
        return(NULL);
    }
    if (value == NULL) {
        return(NULL);
    }
    if (attr == NULL) {
        return(NULL);
    }

    /*
     * Create the Ref table if needed.
     */
    table = (xmlRefTablePtr) doc->refs;
    if (table == NULL) {
        doc->refs = table = xmlHashCreateDict(0, doc->dict);
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
            "xmlAddRef: Table creation failed!\n");
        return(NULL);
    }

    ret = (xmlRefPtr) xmlMalloc(sizeof(xmlRef));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
        return(NULL);
    }

    /*
     * fill the structure.
     */
    ret->value = xmlStrdup(value);
    if (xmlIsStreaming(ctxt)) {
	/*
	 * Operating in streaming mode, attr is gonna disappear
	 */
	ret->name = xmlStrdup(attr->name);
	ret->attr = NULL;
    } else {
	ret->name = NULL;
	ret->attr = attr;
    }
    ret->lineno = xmlGetLineNo(attr->parent);

    /* To add a reference :-
     * References are maintained as a list of references,
     * Lookup the entry, if no entry create new nodelist
     * Add the owning node to the NodeList
     * Return the ref
     */

    if (NULL == (ref_list = xmlHashLookup(table, value))) {
        if (NULL == (ref_list = xmlListCreate(xmlFreeRef, xmlDummyCompare))) {
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list creation failed!\n",
		    NULL);
	    goto failed;
        }
        if (xmlHashAddEntry(table, value, ref_list) < 0) {
            xmlListDelete(ref_list);
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list insertion failed!\n",
		    NULL);
	    goto failed;
        }
    }
    if (xmlListAppend(ref_list, ret) != 0) {
	xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "xmlAddRef: Reference list insertion failed!\n",
		    NULL);
        goto failed;
    }
    return(ret);
failed:
    if (ret != NULL) {
        if (ret->value != NULL)
	    xmlFree((char *)ret->value);
        if (ret->name != NULL)
	    xmlFree((char *)ret->name);
        xmlFree(ret);
    }
    return(NULL);
}